

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Bool setContext(XML_Parser parser,XML_Char *context)

{
  XML_Char XVar1;
  DTD *table;
  XML_Bool XVar2;
  XML_Error XVar3;
  NAMED *pNVar4;
  XML_Char *pXVar5;
  bool bVar6;
  PREFIX *local_40;
  PREFIX *prefix;
  ENTITY *e;
  XML_Char *s;
  DTD *dtd;
  XML_Char *context_local;
  XML_Parser parser_local;
  
  table = parser->m_dtd;
  e = (ENTITY *)context;
  dtd = (DTD *)context;
  while( true ) {
    while( true ) {
      if (*(char *)&(dtd->generalEntities).v == '\0') {
        return '\x01';
      }
      if ((*(char *)&e->name == '\f') || (*(char *)&e->name == '\0')) break;
      if (*(char *)&e->name == '=') {
        if ((parser->m_tempPool).ptr == (parser->m_tempPool).start) {
          local_40 = &table->defaultPrefix;
        }
        else {
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar2 = poolGrow(&parser->m_tempPool), XVar2 == '\0')) {
            return '\0';
          }
          pXVar5 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar5 + 1;
          *pXVar5 = '\0';
          local_40 = (PREFIX *)lookup(parser,&table->prefixes,(parser->m_tempPool).start,0x10);
          if (local_40 == (PREFIX *)0x0) {
            return '\0';
          }
          if (local_40->name == (parser->m_tempPool).start) {
            pXVar5 = poolCopyString(&table->pool,local_40->name);
            local_40->name = pXVar5;
            if (local_40->name == (KEY)0x0) {
              return '\0';
            }
          }
          (parser->m_tempPool).ptr = (parser->m_tempPool).start;
        }
        while( true ) {
          dtd = (DTD *)((long)&(((DTD *)e)->generalEntities).v + 1);
          bVar6 = false;
          if (*(char *)&(dtd->generalEntities).v != '\f') {
            bVar6 = *(char *)&(dtd->generalEntities).v != '\0';
          }
          if (!bVar6) break;
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar2 = poolGrow(&parser->m_tempPool), XVar2 == '\0')) {
            return '\0';
          }
          XVar1 = *(XML_Char *)&(dtd->generalEntities).v;
          pXVar5 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar5 + 1;
          *pXVar5 = XVar1;
          e = (ENTITY *)dtd;
        }
        if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
           (XVar2 = poolGrow(&parser->m_tempPool), XVar2 == '\0')) {
          return '\0';
        }
        pXVar5 = (parser->m_tempPool).ptr;
        (parser->m_tempPool).ptr = pXVar5 + 1;
        *pXVar5 = '\0';
        XVar3 = addBinding(parser,local_40,(ATTRIBUTE_ID *)0x0,(parser->m_tempPool).start,
                           &parser->m_inheritedBindings);
        if (XVar3 != XML_ERROR_NONE) {
          return '\0';
        }
        (parser->m_tempPool).ptr = (parser->m_tempPool).start;
        if (*(char *)&(dtd->generalEntities).v != '\0') {
          dtd = (DTD *)((long)&(((DTD *)e)->generalEntities).v + 2);
        }
        e = (ENTITY *)dtd;
      }
      else {
        if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
           (XVar2 = poolGrow(&parser->m_tempPool), XVar2 == '\0')) {
          return '\0';
        }
        XVar1 = *(XML_Char *)&e->name;
        pXVar5 = (parser->m_tempPool).ptr;
        (parser->m_tempPool).ptr = pXVar5 + 1;
        *pXVar5 = XVar1;
        e = (ENTITY *)((long)&e->name + 1);
      }
    }
    if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
       (XVar2 = poolGrow(&parser->m_tempPool), XVar2 == '\0')) break;
    pXVar5 = (parser->m_tempPool).ptr;
    (parser->m_tempPool).ptr = pXVar5 + 1;
    *pXVar5 = '\0';
    pNVar4 = lookup(parser,&table->generalEntities,(parser->m_tempPool).start,0);
    if (pNVar4 != (NAMED *)0x0) {
      *(undefined1 *)&pNVar4[7].name = 1;
    }
    if (*(char *)&e->name != '\0') {
      e = (ENTITY *)((long)&e->name + 1);
    }
    dtd = (DTD *)e;
    (parser->m_tempPool).ptr = (parser->m_tempPool).start;
  }
  return '\0';
}

Assistant:

static XML_Bool
setContext(XML_Parser parser, const XML_Char *context) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  const XML_Char *s = context;

  while (*context != XML_T('\0')) {
    if (*s == CONTEXT_SEP || *s == XML_T('\0')) {
      ENTITY *e;
      if (! poolAppendChar(&parser->m_tempPool, XML_T('\0')))
        return XML_FALSE;
      e = (ENTITY *)lookup(parser, &dtd->generalEntities,
                           poolStart(&parser->m_tempPool), 0);
      if (e)
        e->open = XML_TRUE;
      if (*s != XML_T('\0'))
        s++;
      context = s;
      poolDiscard(&parser->m_tempPool);
    } else if (*s == XML_T(ASCII_EQUALS)) {
      PREFIX *prefix;
      if (poolLength(&parser->m_tempPool) == 0)
        prefix = &dtd->defaultPrefix;
      else {
        if (! poolAppendChar(&parser->m_tempPool, XML_T('\0')))
          return XML_FALSE;
        prefix
            = (PREFIX *)lookup(parser, &dtd->prefixes,
                               poolStart(&parser->m_tempPool), sizeof(PREFIX));
        if (! prefix)
          return XML_FALSE;
        if (prefix->name == poolStart(&parser->m_tempPool)) {
          prefix->name = poolCopyString(&dtd->pool, prefix->name);
          if (! prefix->name)
            return XML_FALSE;
        }
        poolDiscard(&parser->m_tempPool);
      }
      for (context = s + 1; *context != CONTEXT_SEP && *context != XML_T('\0');
           context++)
        if (! poolAppendChar(&parser->m_tempPool, *context))
          return XML_FALSE;
      if (! poolAppendChar(&parser->m_tempPool, XML_T('\0')))
        return XML_FALSE;
      if (addBinding(parser, prefix, NULL, poolStart(&parser->m_tempPool),
                     &parser->m_inheritedBindings)
          != XML_ERROR_NONE)
        return XML_FALSE;
      poolDiscard(&parser->m_tempPool);
      if (*context != XML_T('\0'))
        ++context;
      s = context;
    } else {
      if (! poolAppendChar(&parser->m_tempPool, *s))
        return XML_FALSE;
      s++;
    }
  }
  return XML_TRUE;
}